

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

str __thiscall pybind11::str::format<pybind11::handle&>(str *this,handle *args)

{
  handle local_40;
  PyObject *local_38;
  char *local_30;
  object local_28;
  object local_20;
  
  local_38 = args->m_ptr;
  local_30 = "format";
  local_28.super_handle.m_ptr = (handle)(PyObject *)0x0;
  pybind11::detail::
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::operator()
            ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
              *)&local_20,&local_40);
  str(this,&local_20);
  object::~object(&local_20);
  object::~object(&local_28);
  return (object)(object)this;
}

Assistant:

str format(Args &&...args) const {
        return attr("format")(std::forward<Args>(args)...);
    }